

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

ParseArgumentStatus __thiscall
google::protobuf::compiler::CommandLineInterface::ParseArguments
          (CommandLineInterface *this,int argc,char **argv)

{
  _Rb_tree_node_base *__k;
  char *pcVar1;
  undefined8 uVar2;
  _Base_ptr p_Var3;
  bool bVar4;
  ParseArgumentStatus PVar5;
  Mode MVar6;
  size_t sVar7;
  ostream *poVar8;
  iterator iVar9;
  pointer pOVar10;
  _Base_ptr p_Var11;
  long *plVar12;
  LogMessage *pLVar13;
  size_type sVar14;
  ulong uVar15;
  ulong *puVar16;
  long lVar17;
  int iVar18;
  undefined1 *puVar19;
  _Rb_tree_node_base *p_Var20;
  pointer directive;
  CommandLineInterface *pCVar21;
  ParseArgumentStatus PVar22;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar23;
  int iVar24;
  char *pcVar25;
  bool bVar26;
  string value;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  string local_e8;
  undefined1 local_c8 [32];
  _Alloc_hider local_a8;
  char local_98 [16];
  _Base_ptr local_88;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  ulong local_60;
  _Rb_tree_node_base *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pmVar23 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(ulong)(uint)argc;
  pcVar25 = *argv;
  pcVar1 = (char *)(this->executable_name_)._M_string_length;
  strlen(pcVar25);
  std::__cxx11::string::_M_replace((ulong)this,0,pcVar1,(ulong)pcVar25);
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (argc < 2) {
LAB_0022f3ef:
    PVar22 = PARSE_ARGUMENT_DONE_AND_EXIT;
    PrintHelpText(this);
    goto LAB_0022f46e;
  }
  puVar19 = (undefined1 *)0x1;
  local_88 = (_Base_ptr)argv;
  local_80 = pmVar23;
  do {
    pcVar25 = *(char **)(&((_Base_ptr)argv)->_M_color + (long)puVar19 * 2);
    if (*pcVar25 == '@') {
      local_c8._0_8_ = local_c8 + 0x10;
      sVar7 = strlen(pcVar25 + 1);
      pCVar21 = (CommandLineInterface *)local_c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c8,pcVar25 + 1,pcVar25 + sVar7 + 1);
      bVar4 = ExpandArgumentFile(pCVar21,(string *)local_c8,&local_78);
      pCVar21 = (CommandLineInterface *)local_c8._0_8_;
      if ((CommandLineInterface *)local_c8._0_8_ != (CommandLineInterface *)(local_c8 + 0x10)) {
        operator_delete((void *)local_c8._0_8_);
      }
      p_Var3 = local_88;
      pmVar23 = local_80;
      argv = (char **)local_88;
      if (!bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Failed to open argument file: ",0x1e);
        pcVar25 = (char *)(*(long *)(&p_Var3->_M_color + (long)puVar19 * 2) + 1);
        sVar7 = strlen(pcVar25);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar25,sVar7);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
        std::ostream::put(' ');
        std::ostream::flush();
        PVar22 = PARSE_ARGUMENT_FAIL;
        goto LAB_0022f46e;
      }
    }
    else {
      std::__cxx11::string::string((string *)local_c8,pcVar25,(allocator *)&local_e8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
      pCVar21 = (CommandLineInterface *)local_c8._0_8_;
      if ((CommandLineInterface *)local_c8._0_8_ != (CommandLineInterface *)(local_c8 + 0x10)) {
        operator_delete((void *)local_c8._0_8_);
      }
    }
    puVar19 = puVar19 + 1;
  } while (pmVar23 !=
           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)puVar19);
  if (local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0022f3ef;
  PVar22 = PARSE_ARGUMENT_FAIL;
  uVar15 = 0;
  iVar24 = 0;
  do {
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    local_c8._0_8_ = local_c8 + 0x10;
    local_c8._8_8_ = (_Base_ptr)0x0;
    local_c8._16_8_ = local_c8._16_8_ & 0xffffffffffffff00;
    local_e8._M_string_length = 0;
    local_e8.field_2._M_allocated_capacity =
         local_e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    bVar4 = ParseArgument(pCVar21,*(char **)(local_78.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start + uVar15),
                          (string *)local_c8,&local_e8);
    if (bVar4) {
      iVar18 = iVar24 + 1;
      if (((long)local_78.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_78.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5 != (long)iVar18) &&
         (**(char **)(local_78.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + iVar18) != '-')) {
        std::__cxx11::string::_M_assign((string *)&local_e8);
        iVar24 = iVar18;
        goto LAB_0022f35d;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Missing value for flag: ",0x18);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_c8._0_8_,local_c8._8_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      iVar18 = std::__cxx11::string::compare((char *)local_c8);
      if (iVar18 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"To decode an unknown message, use --decode_raw.",0x2f);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
        std::ostream::put(' ');
        std::ostream::flush();
      }
      bVar4 = false;
      PVar22 = PARSE_ARGUMENT_FAIL;
    }
    else {
LAB_0022f35d:
      PVar5 = InterpretArgument(this,(string *)local_c8,&local_e8);
      bVar4 = PVar5 == PARSE_ARGUMENT_DONE_AND_CONTINUE;
      if (!bVar4) {
        PVar22 = PVar5;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    pCVar21 = (CommandLineInterface *)local_c8._0_8_;
    if ((CommandLineInterface *)local_c8._0_8_ != (CommandLineInterface *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_);
    }
    if (!bVar4) goto LAB_0022f46e;
    iVar24 = iVar24 + 1;
    uVar15 = (ulong)iVar24;
  } while (uVar15 < (ulong)((long)local_78.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_78.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5));
  p_Var11 = (this->plugin_parameters_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var20 = &(this->plugin_parameters_)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var11 != p_Var20) {
    local_80 = &this->plugins_;
    local_88 = &(this->plugins_)._M_t._M_impl.super__Rb_tree_header._M_header;
    uVar15 = 0;
    local_58 = p_Var20;
    do {
      while( true ) {
        local_60 = uVar15;
        __k = p_Var11 + 1;
        iVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&local_80->_M_t,(key_type *)__k);
        if (iVar9._M_node == local_88) break;
LAB_0022f5b3:
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
        uVar15 = local_60;
        if (p_Var11 == p_Var20) {
          PVar22 = PARSE_ARGUMENT_FAIL;
          if ((local_60 & 1) == 0) goto LAB_0022f777;
          goto LAB_0022f46e;
        }
      }
      directive = (this->output_directives_).
                  super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      pOVar10 = (this->output_directives_).
                super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (directive != pOVar10) {
        bVar4 = false;
        do {
          if (directive->generator == (CodeGenerator *)0x0) {
            anon_unknown_4::PluginName
                      ((string *)local_c8,(anon_unknown_4 *)(this->plugin_prefix_)._M_dataplus._M_p,
                       (string *)(this->plugin_prefix_)._M_string_length,&directive->name);
            uVar2 = local_c8._0_8_;
            if ((_Base_ptr)local_c8._8_8_ == p_Var11[1]._M_parent) {
              if ((_Base_ptr)local_c8._8_8_ == (_Base_ptr)0x0) {
                bVar26 = true;
                bVar4 = true;
              }
              else {
                iVar24 = bcmp((void *)local_c8._0_8_,*(void **)__k,local_c8._8_8_);
                bVar26 = iVar24 == 0;
                bVar4 = (bool)(bVar4 | bVar26);
              }
            }
            else {
              bVar26 = false;
            }
            if ((CommandLineInterface *)uVar2 != (CommandLineInterface *)(local_c8 + 0x10)) {
              operator_delete((void *)uVar2);
            }
            if (bVar26) break;
            pOVar10 = (this->output_directives_).
                      super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          directive = directive + 1;
        } while (directive != pOVar10);
        p_Var20 = local_58;
        if (bVar4) goto LAB_0022f5b3;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Unknown flag: ",0xe)
      ;
      std::__cxx11::string::substr((ulong)local_50,(ulong)__k);
      plVar12 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x3d7ae7);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      puVar16 = (ulong *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar16) {
        local_e8.field_2._M_allocated_capacity = *puVar16;
        local_e8.field_2._8_8_ = plVar12[3];
      }
      else {
        local_e8.field_2._M_allocated_capacity = *puVar16;
        local_e8._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_e8._M_string_length = plVar12[1];
      *plVar12 = (long)puVar16;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_e8);
      pCVar21 = (CommandLineInterface *)(plVar12 + 2);
      if ((CommandLineInterface *)*plVar12 == pCVar21) {
        local_c8._16_8_ = (pCVar21->executable_name_)._M_dataplus._M_p;
        local_c8._24_8_ = plVar12[3];
        local_c8._0_8_ = (CommandLineInterface *)(local_c8 + 0x10);
      }
      else {
        local_c8._16_8_ = (pCVar21->executable_name_)._M_dataplus._M_p;
        local_c8._0_8_ = (CommandLineInterface *)*plVar12;
      }
      local_c8._8_8_ = plVar12[1];
      *plVar12 = (long)pCVar21;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_c8._0_8_,local_c8._8_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      if ((CommandLineInterface *)local_c8._0_8_ != (CommandLineInterface *)(local_c8 + 0x10)) {
        operator_delete((void *)local_c8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
      PVar22 = PARSE_ARGUMENT_FAIL;
      uVar15 = CONCAT71((int7)((ulong)p_Var11 >> 8),1);
    } while (p_Var11 != p_Var20);
    goto LAB_0022f46e;
  }
LAB_0022f777:
  if (((this->proto_path_).
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (this->proto_path_).
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((this->descriptor_set_in_names_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->descriptor_set_in_names_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[1],_const_char_(&)[2],_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_c8,(char (*) [1])0x3d75d9,(char (*) [2])0x434dd2);
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&this->proto_path_,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_c8);
    if (local_a8._M_p != local_98) {
      operator_delete(local_a8._M_p);
    }
    if ((CommandLineInterface *)local_c8._0_8_ != (CommandLineInterface *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_);
    }
  }
  MVar6 = this->mode_;
  switch(MVar6) {
  case MODE_COMPILE:
    if ((this->input_files_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->input_files_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0022f91a:
      if (((this->output_directives_).
           super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           (this->output_directives_).
           super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
           ._M_impl.super__Vector_impl_data._M_finish) ||
         ((this->descriptor_set_out_name_)._M_string_length != 0)) goto LAB_0022f97c;
      lVar17 = 0x1a;
      pcVar25 = "Missing output directives.";
      goto LAB_0022f9bd;
    }
LAB_0022f84c:
    lVar17 = 0x13;
    pcVar25 = "Missing input file.";
    goto LAB_0022f8cb;
  case MODE_ENCODE:
  case MODE_PRINT:
switchD_0022f806_caseD_1:
    if (((this->input_files_).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (this->input_files_).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       ((this->descriptor_set_in_names_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->descriptor_set_in_names_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) goto LAB_0022f84c;
    break;
  case MODE_DECODE:
    if ((this->codec_type_)._M_string_length != 0) goto switchD_0022f806_caseD_1;
    lVar17 = 0x38;
    pcVar25 = "When using --decode_raw, no input files should be given.";
    if (((this->input_files_).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (this->input_files_).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       ((this->descriptor_set_in_names_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->descriptor_set_in_names_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) goto LAB_0022f9bd;
    if ((this->dependency_out_name_)._M_string_length == 0) goto LAB_0022f97c;
    goto LAB_0022f8c4;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_c8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
               ,0x613);
    pLVar13 = internal::LogMessage::operator<<((LogMessage *)local_c8,"Unexpected mode: ");
    pLVar13 = internal::LogMessage::operator<<(pLVar13,this->mode_);
    internal::LogFinisher::operator=((LogFinisher *)&local_e8,pLVar13);
    internal::LogMessage::~LogMessage((LogMessage *)local_c8);
    MVar6 = this->mode_;
    if (MVar6 == MODE_COMPILE) goto LAB_0022f91a;
  }
  if ((this->dependency_out_name_)._M_string_length != 0) {
LAB_0022f8c4:
    lVar17 = 0x38;
    pcVar25 = "Can only use --dependency_out=FILE when generating code.";
LAB_0022f8cb:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar25,lVar17);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    PVar22 = PARSE_ARGUMENT_FAIL;
    goto LAB_0022f46e;
  }
  if (MVar6 == MODE_ENCODE) {
LAB_0022f9e0:
    sVar14 = (this->descriptor_set_out_name_)._M_string_length;
    if ((sVar14 == 0 & this->imports_in_descriptor_set_) == 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "--include_imports only makes sense when combined with --descriptor_set_out.",0x4b)
      ;
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      sVar14 = (this->descriptor_set_out_name_)._M_string_length;
    }
    PVar22 = PARSE_ARGUMENT_DONE_AND_CONTINUE;
    if ((this->source_info_in_descriptor_set_ == true) && (sVar14 == 0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "--include_source_info only makes sense when combined with --descriptor_set_out.",
                 0x4f);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      PVar22 = PARSE_ARGUMENT_DONE_AND_CONTINUE;
    }
  }
  else {
LAB_0022f97c:
    if (this->deterministic_output_ == false) {
      if (((this->dependency_out_name_)._M_string_length == 0) ||
         ((ulong)((long)(this->input_files_).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->input_files_).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x21)) goto LAB_0022f9e0;
      lVar17 = 0x41;
      pcVar25 = "Can only process one input file when using --dependency_out=FILE.";
    }
    else {
      lVar17 = 0x32;
      pcVar25 = "Can only use --deterministic_output with --encode.";
    }
LAB_0022f9bd:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar25,lVar17);
    PVar22 = PARSE_ARGUMENT_FAIL;
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  }
LAB_0022f46e:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  return PVar22;
}

Assistant:

CommandLineInterface::ParseArgumentStatus CommandLineInterface::ParseArguments(
    int argc, const char* const argv[]) {
  executable_name_ = argv[0];

  std::vector<std::string> arguments;
  for (int i = 1; i < argc; ++i) {
    if (argv[i][0] == '@') {
      if (!ExpandArgumentFile(argv[i] + 1, &arguments)) {
        std::cerr << "Failed to open argument file: " << (argv[i] + 1)
                  << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }
      continue;
    }
    arguments.push_back(argv[i]);
  }

  // if no arguments are given, show help
  if (arguments.empty()) {
    PrintHelpText();
    return PARSE_ARGUMENT_DONE_AND_EXIT;  // Exit without running compiler.
  }

  // Iterate through all arguments and parse them.
  for (int i = 0; i < arguments.size(); ++i) {
    std::string name, value;

    if (ParseArgument(arguments[i].c_str(), &name, &value)) {
      // Returned true => Use the next argument as the flag value.
      if (i + 1 == arguments.size() || arguments[i + 1][0] == '-') {
        std::cerr << "Missing value for flag: " << name << std::endl;
        if (name == "--decode") {
          std::cerr << "To decode an unknown message, use --decode_raw."
                    << std::endl;
        }
        return PARSE_ARGUMENT_FAIL;
      } else {
        ++i;
        value = arguments[i];
      }
    }

    ParseArgumentStatus status = InterpretArgument(name, value);
    if (status != PARSE_ARGUMENT_DONE_AND_CONTINUE) return status;
  }

  // Make sure each plugin option has a matching plugin output.
  bool foundUnknownPluginOption = false;
  for (std::map<std::string, std::string>::const_iterator i =
           plugin_parameters_.begin();
       i != plugin_parameters_.end(); ++i) {
    if (plugins_.find(i->first) != plugins_.end()) {
      continue;
    }
    bool foundImplicitPlugin = false;
    for (std::vector<OutputDirective>::const_iterator j =
             output_directives_.begin();
         j != output_directives_.end(); ++j) {
      if (j->generator == NULL) {
        std::string plugin_name = PluginName(plugin_prefix_, j->name);
        if (plugin_name == i->first) {
          foundImplicitPlugin = true;
          break;
        }
      }
    }
    if (!foundImplicitPlugin) {
      std::cerr << "Unknown flag: "
                // strip prefix + "gen-" and add back "_opt"
                << "--" + i->first.substr(plugin_prefix_.size() + 4) + "_opt"
                << std::endl;
      foundUnknownPluginOption = true;
    }
  }
  if (foundUnknownPluginOption) {
    return PARSE_ARGUMENT_FAIL;
  }

  // The --proto_path & --descriptor_set_in flags both specify places to look
  // for proto files. If neither were given, use the current working directory.
  if (proto_path_.empty() && descriptor_set_in_names_.empty()) {
    // Don't use make_pair as the old/default standard library on Solaris
    // doesn't support it without explicit template parameters, which are
    // incompatible with C++0x's make_pair.
    proto_path_.push_back(std::pair<std::string, std::string>("", "."));
  }

  // Check error cases that span multiple flag values.
  bool missing_proto_definitions = false;
  switch (mode_) {
    case MODE_COMPILE:
      missing_proto_definitions = input_files_.empty();
      break;
    case MODE_DECODE:
      // Handle --decode_raw separately, since it requires that no proto
      // definitions are specified.
      if (codec_type_.empty()) {
        if (!input_files_.empty() || !descriptor_set_in_names_.empty()) {
          std::cerr
              << "When using --decode_raw, no input files should be given."
              << std::endl;
          return PARSE_ARGUMENT_FAIL;
        }
        missing_proto_definitions = false;
        break;  // only for --decode_raw
      }
      // --decode (not raw) is handled the same way as the rest of the modes.
      PROTOBUF_FALLTHROUGH_INTENDED;
    case MODE_ENCODE:
    case MODE_PRINT:
      missing_proto_definitions =
          input_files_.empty() && descriptor_set_in_names_.empty();
      break;
    default:
      GOOGLE_LOG(FATAL) << "Unexpected mode: " << mode_;
  }
  if (missing_proto_definitions) {
    std::cerr << "Missing input file." << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ == MODE_COMPILE && output_directives_.empty() &&
      descriptor_set_out_name_.empty()) {
    std::cerr << "Missing output directives." << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ != MODE_COMPILE && !dependency_out_name_.empty()) {
    std::cerr << "Can only use --dependency_out=FILE when generating code."
              << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ != MODE_ENCODE && deterministic_output_) {
    std::cerr << "Can only use --deterministic_output with --encode."
              << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (!dependency_out_name_.empty() && input_files_.size() > 1) {
    std::cerr
        << "Can only process one input file when using --dependency_out=FILE."
        << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (imports_in_descriptor_set_ && descriptor_set_out_name_.empty()) {
    std::cerr << "--include_imports only makes sense when combined with "
                 "--descriptor_set_out."
              << std::endl;
  }
  if (source_info_in_descriptor_set_ && descriptor_set_out_name_.empty()) {
    std::cerr << "--include_source_info only makes sense when combined with "
                 "--descriptor_set_out."
              << std::endl;
  }

  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
}